

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int __status;
  
  std::ofstream::open((char *)&jlog,0x120398);
  smoke_test();
  test_scalar_constructors();
  test_scalar_assign();
  test_scalar_copy();
  test_scalar_equality();
  test_scalar_move();
  test_get_type();
  test_raw_values();
  test_comparison_operators();
  test_append();
  test_insert();
  test_square_brackets();
  test_scalar_casts();
  test_json_class_exceptions();
  test_numbers();
  test_readers();
  test_writers();
  test_strings();
  test_parse();
  test_options();
  test_pointer();
  std::ofstream::close();
  __status = check_results();
  exit(__status);
}

Assistant:

int main(int argc, char *argv[])
{
    jlog.open("test_files/jlog.txt");
    try
    {
        smoke_test();
        test_scalar_constructors();
        test_scalar_assign();
        test_scalar_copy();
        test_scalar_equality();
        test_scalar_move();
        test_get_type();
        test_raw_values();
        test_comparison_operators();
        test_append();
        test_insert();
        test_square_brackets();
        test_scalar_casts();
        test_json_class_exceptions();
        test_numbers();
        test_readers();
        test_writers();
        test_strings();
        test_parse();
        test_options();
        test_pointer();
    }
    catch (json_exception &e)
    {
        jlog << e.what() << endl;
    }

    jlog.close();
    exit(check_results());
}